

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::ExpressionBinder>,_true> * __thiscall
duckdb::Binder::GetActiveBinders(Binder *this)

{
  for (; ((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0 && (this->binder_type == REGULAR_BINDER));
      this = shared_ptr<duckdb::Binder,_true>::operator*(&this->parent)) {
  }
  return &this->active_binders;
}

Assistant:

vector<reference<ExpressionBinder>> &Binder::GetActiveBinders() {
	reference<Binder> root = *this;
	while (root.get().parent && root.get().binder_type == BinderType::REGULAR_BINDER) {
		root = *root.get().parent;
	}
	auto &root_binder = root.get();
	return root_binder.active_binders;
}